

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void check_stat(Emulator *e)

{
  Emulator *e_local;
  
  if (((e->state).ppu.stat.if_ == FALSE) &&
     (((((e->state).ppu.stat.trigger_mode == PPU_MODE_HBLANK &&
        ((e->state).ppu.stat.hblank.irq != FALSE)) ||
       (((e->state).ppu.stat.trigger_mode == PPU_MODE_VBLANK &&
        ((e->state).ppu.stat.vblank.irq != FALSE)))) ||
      ((((e->state).ppu.stat.mode2.trigger != FALSE && ((e->state).ppu.stat.mode2.irq != FALSE)) ||
       (((e->state).ppu.stat.y_compare.trigger != FALSE &&
        ((e->state).ppu.stat.y_compare.irq != FALSE)))))))) {
    HOOK_trigger_stat_ii(e,"check_stat",(ulong)(e->state).ppu.ly,(e->state).ticks + 4);
    (e->state).interrupt.new_if = (e->state).interrupt.new_if | 2;
    if ((((e->state).ppu.stat.trigger_mode != PPU_MODE_VBLANK) ||
        ((e->state).ppu.stat.vblank.irq == FALSE)) &&
       (((e->state).ppu.stat.y_compare.trigger == FALSE ||
        ((e->state).ppu.stat.y_compare.irq == FALSE)))) {
      (e->state).interrupt.if_ = (e->state).interrupt.if_ | 2;
    }
    (e->state).ppu.stat.if_ = TRUE;
  }
  else if ((((((e->state).ppu.stat.trigger_mode != PPU_MODE_HBLANK) ||
             ((e->state).ppu.stat.hblank.irq == FALSE)) &&
            (((e->state).ppu.stat.trigger_mode != PPU_MODE_VBLANK ||
             ((e->state).ppu.stat.vblank.irq == FALSE)))) &&
           (((e->state).ppu.stat.trigger_mode != PPU_MODE_MODE2 ||
            ((e->state).ppu.stat.mode2.irq == FALSE)))) &&
          (((e->state).ppu.stat.new_ly_eq_lyc == FALSE ||
           ((e->state).ppu.stat.y_compare.irq == FALSE)))) {
    (e->state).ppu.stat.if_ = FALSE;
  }
  return;
}

Assistant:

static void check_stat(Emulator* e) {
  if (!STAT.if_ && SHOULD_TRIGGER_STAT) {
    HOOK(trigger_stat_ii, PPU.ly, TICKS + CPU_TICK);
    INTR.new_if |= IF_STAT;
    if (!(TRIGGER_VBLANK || TRIGGER_Y_COMPARE)) {
      INTR.if_ |= IF_STAT;
    }
    STAT.if_ = TRUE;
  } else if (!(TRIGGER_HBLANK || TRIGGER_VBLANK || CHECK_MODE2 ||
               CHECK_Y_COMPARE)) {
    STAT.if_ = FALSE;
  }
}